

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O1

size_t rtosc_message_ring_length(ring_t *ring)

{
  ulong uVar1;
  uint uVar2;
  ring_t *prVar3;
  ulong uVar4;
  size_t sVar5;
  byte bVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  ring_t *prVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  bool bVar19;
  
  uVar1 = ring->len;
  prVar3 = ring;
  if (uVar1 == 0) {
    if (ring[1].len == 0) goto LAB_001113ff;
    prVar3 = ring + 1;
  }
  if (*prVar3->data == '#') {
    uVar4 = 1;
    prVar3 = ring;
    if (uVar1 < 2) {
      uVar4 = 1 - uVar1;
      if (ring[1].len <= uVar4) goto LAB_001113ff;
      prVar3 = ring + 1;
    }
    if (prVar3->data[uVar4] != 'b') goto LAB_001113ff;
    uVar4 = 2;
    prVar3 = ring;
    if (uVar1 < 3) {
      uVar4 = 2 - uVar1;
      if (ring[1].len <= uVar4) goto LAB_001113ff;
      prVar3 = ring + 1;
    }
    if (prVar3->data[uVar4] != 'u') goto LAB_001113ff;
    uVar4 = 3;
    prVar3 = ring;
    if (uVar1 < 4) {
      uVar4 = 3 - uVar1;
      if (ring[1].len <= uVar4) goto LAB_001113ff;
      prVar3 = ring + 1;
    }
    if (prVar3->data[uVar4] != 'n') goto LAB_001113ff;
    uVar4 = 4;
    prVar3 = ring;
    if (uVar1 < 5) {
      uVar4 = 4 - uVar1;
      if (ring[1].len <= uVar4) goto LAB_001113ff;
      prVar3 = ring + 1;
    }
    if (prVar3->data[uVar4] != 'd') goto LAB_001113ff;
    uVar4 = 5;
    prVar3 = ring;
    if (uVar1 < 6) {
      uVar4 = 5 - uVar1;
      if (ring[1].len <= uVar4) goto LAB_001113ff;
      prVar3 = ring + 1;
    }
    if (prVar3->data[uVar4] != 'l') goto LAB_001113ff;
    uVar4 = 6;
    prVar3 = ring;
    if (uVar1 < 7) {
      uVar4 = 6 - uVar1;
      if (ring[1].len <= uVar4) goto LAB_001113ff;
      prVar3 = ring + 1;
    }
    if (prVar3->data[uVar4] != 'e') goto LAB_001113ff;
    uVar4 = 7;
    prVar3 = ring;
    if (uVar1 < 8) {
      uVar4 = 7 - uVar1;
      if (ring[1].len <= uVar4) goto LAB_00111756;
      prVar3 = ring + 1;
    }
    if (prVar3->data[uVar4] == '\0') {
LAB_00111756:
      sVar5 = bundle_ring_length(ring);
      return sVar5;
    }
  }
LAB_001113ff:
  uVar8 = 3;
  do {
    uVar2 = uVar8;
    uVar11 = (ulong)(uVar2 - 3);
    uVar4 = uVar11;
    prVar3 = ring;
    if ((uVar11 < uVar1) ||
       (bVar19 = true, uVar4 = uVar11 - uVar1, prVar3 = ring + 1, uVar11 - uVar1 < ring[1].len)) {
      bVar19 = prVar3->data[uVar4] == '\0';
    }
    uVar8 = uVar2 + 1;
  } while (!bVar19);
  uVar4 = (ulong)(uVar2 - 3);
  iVar15 = 4;
  do {
    uVar17 = (uint)uVar4;
    uVar4 = (ulong)(uVar17 + 1);
    uVar11 = uVar4;
    prVar3 = ring;
    if (((uVar4 < uVar1) || (uVar11 = uVar4 - uVar1, prVar3 = ring + 1, uVar4 - uVar1 < ring[1].len)
        ) && (prVar3->data[uVar11] != '\0')) {
      uVar8 = uVar17 + 1;
      uVar2 = uVar17;
      break;
    }
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  uVar4 = (ulong)uVar8;
  prVar3 = ring;
  if (uVar1 <= uVar4) {
    if (ring[1].len <= uVar4 - uVar1) {
      return 0;
    }
    prVar3 = ring + 1;
    uVar4 = uVar4 - uVar1;
  }
  if (prVar3->data[uVar4] != ',') {
    return 0;
  }
  iVar15 = uVar8 + 5;
  uVar17 = uVar8;
  uVar16 = (uint)(byte)((char)uVar8 - (char)uVar2);
  do {
    uVar9 = uVar16;
    iVar12 = iVar15;
    uVar17 = uVar17 + 1;
    uVar11 = (ulong)uVar17;
    uVar4 = uVar11;
    prVar3 = ring;
    if ((uVar1 <= uVar11) &&
       (uVar4 = uVar11 - uVar1, prVar3 = ring + 1, ring[1].len <= uVar11 - uVar1)) break;
    iVar15 = iVar12 + 1;
    uVar16 = uVar9 + 1;
  } while (prVar3->data[uVar4] != '\0');
  iVar15 = 0;
  uVar17 = uVar8;
  while( true ) {
    uVar17 = uVar17 + 1;
    uVar11 = (ulong)uVar17;
    uVar4 = uVar11;
    prVar3 = ring;
    if (((uVar1 <= uVar11) &&
        (uVar4 = uVar11 - uVar1, prVar3 = ring + 1, ring[1].len <= uVar11 - uVar1)) ||
       (prVar3->data[uVar4] == '\0')) break;
    prVar3 = ring;
    uVar4 = uVar11;
    if ((uVar11 < uVar1) ||
       (prVar3 = ring + 1, uVar4 = uVar11 - uVar1, uVar11 - uVar1 < ring[1].len)) {
      bVar6 = prVar3->data[uVar4];
    }
    else {
      bVar6 = 0;
    }
    if ((0x2e < bVar6 - 0x46) ||
       (iVar18 = 1, (0x708d70002000U >> ((ulong)(bVar6 - 0x46) & 0x3f) & 1) == 0)) {
      iVar18 = 0;
    }
    iVar15 = iVar15 + iVar18;
  }
  uVar17 = iVar12 - (uVar9 & 3);
  if (iVar15 != 0) {
    uVar16 = uVar2 + 2;
    prVar3 = ring + 1;
    do {
      uVar11 = (ulong)uVar16;
      prVar10 = ring;
      uVar4 = uVar11;
      if ((uVar11 < uVar1) ||
         (prVar10 = prVar3, uVar4 = uVar11 - uVar1, uVar11 - uVar1 < ring[1].len)) {
        cVar7 = prVar10->data[uVar4];
      }
      else {
        cVar7 = '\0';
      }
      switch(cVar7) {
      case 'b':
        uVar11 = (ulong)uVar17;
        uVar4 = uVar11;
        prVar10 = ring;
        if ((uVar11 < uVar1) ||
           (iVar12 = 0, uVar4 = uVar11 - uVar1, prVar10 = prVar3, uVar11 - uVar1 < ring[1].len)) {
          iVar12 = (uint)(byte)prVar10->data[uVar4] << 0x18;
        }
        uVar11 = (ulong)(uVar17 + 1);
        prVar10 = ring;
        uVar4 = uVar11;
        if ((uVar11 < uVar1) ||
           (iVar18 = 0, prVar10 = prVar3, uVar4 = uVar11 - uVar1, uVar11 - uVar1 < ring[1].len)) {
          iVar18 = (uint)(byte)prVar10->data[uVar4] << 0x10;
        }
        uVar11 = (ulong)(uVar17 + 2);
        prVar10 = ring;
        uVar4 = uVar11;
        if ((uVar11 < uVar1) ||
           (iVar14 = 0, prVar10 = prVar3, uVar4 = uVar11 - uVar1, uVar11 - uVar1 < ring[1].len)) {
          iVar14 = (uint)(byte)prVar10->data[uVar4] << 8;
        }
        uVar11 = (ulong)(uVar17 + 3);
        uVar4 = uVar11;
        prVar10 = ring;
        if ((uVar11 < uVar1) ||
           (uVar9 = 0, uVar4 = uVar11 - uVar1, prVar10 = prVar3, uVar11 - uVar1 < ring[1].len)) {
          uVar9 = (uint)(byte)prVar10->data[uVar4];
        }
        uVar9 = uVar9 + iVar18 + iVar14 + uVar17 + iVar12 + 4;
        uVar13 = uVar9 - uVar8 & 3;
        uVar17 = (uVar9 - uVar13) + 4;
        if (uVar13 == 0) {
          uVar17 = uVar9;
        }
        goto LAB_0011172d;
      case 'c':
      case 'f':
      case 'i':
      case 'm':
      case 'r':
        uVar17 = uVar17 + 4;
        goto LAB_0011172d;
      case 'd':
      case 'h':
      case 't':
        uVar17 = uVar17 + 8;
LAB_0011172d:
        iVar15 = iVar15 + -1;
        break;
      case 'e':
      case 'g':
      case 'j':
      case 'k':
      case 'l':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
        break;
      case 's':
switchD_001115f2_caseD_73:
        uVar9 = (byte)-(char)uVar2 + uVar17;
        iVar12 = uVar17 + 5;
        do {
          iVar18 = iVar12;
          uVar13 = uVar9;
          uVar17 = uVar17 + 1;
          uVar11 = (ulong)uVar17;
          prVar10 = ring;
          uVar4 = uVar11;
          if ((uVar1 <= uVar11) &&
             (prVar10 = prVar3, uVar4 = uVar11 - uVar1, ring[1].len <= uVar11 - uVar1)) break;
          uVar9 = uVar13 + 1;
          iVar12 = iVar18 + 1;
        } while (prVar10->data[uVar4] != '\0');
        uVar17 = iVar18 - (uVar13 & 3);
        iVar15 = iVar15 + -1;
        break;
      default:
        if (cVar7 == 'S') goto switchD_001115f2_caseD_73;
      }
      uVar16 = uVar16 + 1;
    } while (iVar15 != 0);
  }
  if ((ulong)uVar17 <= uVar1 + ring[1].len) {
    return (ulong)uVar17;
  }
  return 0;
}

Assistant:

size_t rtosc_message_ring_length(ring_t *ring)
{
    //Check if the message is a bundle
    if(deref(0,ring) == '#' &&
            deref(1,ring) == 'b' &&
            deref(2,ring) == 'u' &&
            deref(3,ring) == 'n' &&
            deref(4,ring) == 'd' &&
            deref(5,ring) == 'l' &&
            deref(6,ring) == 'e' &&
            deref(7,ring) == '\0')
        return bundle_ring_length(ring);

    //Proceed for normal messages
    //Consume path
    unsigned pos = 0;
    while(deref(pos++,ring));
    pos--;

    //Travel through the null word end [1..4] bytes
    for(int i=0; i<4; ++i)
        if(deref(++pos, ring))
            break;

    if(deref(pos, ring) != ',')
        return 0;

    unsigned aligned_pos = pos;
    int arguments = pos+1;
    while(deref(++pos,ring));
    pos += 4-(pos-aligned_pos)%4;

    unsigned toparse = 0;
    {
        int arg = arguments-1;
        while(deref(++arg,ring))
            toparse += has_reserved(deref(arg,ring));
    }

    //Take care of varargs
    while(toparse)
    {
        char arg = deref(arguments++,ring);
        assert(arg);
        uint32_t i;
        switch(arg) {
            case 'h':
            case 't':
            case 'd':
                pos += 8;
                --toparse;
                break;
            case 'm':
            case 'r':
            case 'c':
            case 'f':
            case 'i':
                pos += 4;
                --toparse;
                break;
            case 'S':
            case 's':
                while(deref(++pos,ring));
                pos += 4-(pos-aligned_pos)%4;
                --toparse;
                break;
            case 'b':
                i = 0;
                i |= (deref(pos++,ring) << 24);
                i |= (deref(pos++,ring) << 16);
                i |= (deref(pos++,ring) << 8);
                i |= (deref(pos++,ring));
                pos += i;
                if((pos-aligned_pos)%4)
                    pos += 4-(pos-aligned_pos)%4;
                --toparse;
                break;
            default:
                ;
        }
    }


    return pos <= (ring[0].len+ring[1].len) ? pos : 0;
}